

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O3

void Kit_SopMakeCubeFree(Kit_Sop_t *cSop)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  long lVar5;
  
  iVar1 = cSop->nCubes;
  if (0 < (long)iVar1) {
    uVar4 = 0xffffffff;
    lVar5 = 0;
    do {
      if (cSop->pCubes[lVar5] == 0) break;
      uVar4 = uVar4 & cSop->pCubes[lVar5];
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
    if (uVar4 != 0 && 0 < iVar1) {
      puVar3 = cSop->pCubes;
      lVar5 = 0;
      do {
        uVar2 = puVar3[lVar5];
        if (uVar2 == 0) {
          return;
        }
        puVar3[lVar5] = uVar2 & ~uVar4;
        lVar5 = lVar5 + 1;
      } while (lVar5 < cSop->nCubes);
    }
  }
  return;
}

Assistant:

void Kit_SopMakeCubeFree( Kit_Sop_t * cSop )
{
    unsigned uMask, uCube;
    int i;
    uMask = Kit_SopCommonCube( cSop );
    if ( uMask == 0 )
        return;
    // remove the common cube
    Kit_SopForEachCube( cSop, uCube, i )
        Kit_SopWriteCube( cSop, Kit_CubeSharp(uCube, uMask), i );
}